

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_alloc.c
# Opt level: O3

ObjectType * NewObjectType(void)

{
  ObjectType *pOVar1;
  
  pOVar1 = (ObjectType *)malloc(0x20);
  pOVar1->Next = (ObjectType *)0x0;
  pOVar1->Image = (ALLEGRO_BITMAP *)0x0;
  pOVar1->CollectNoise = (ALLEGRO_SAMPLE *)0x0;
  return pOVar1;
}

Assistant:

struct ObjectType *NewObjectType()
{
   struct ObjectType *r =
      (struct ObjectType *)malloc(sizeof(struct ObjectType));

   r->Next = NULL;
   r->Image = NULL;
   r->CollectNoise = NULL;
   return r;
}